

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O2

void __thiscall
DReachabilityPropagator::verificationDFS
          (DReachabilityPropagator *this,int r,vector<bool,_std::allocator<bool>_> *v)

{
  uint uVar1;
  pointer pvVar2;
  uint *puVar3;
  BoolView *pBVar4;
  bool bVar5;
  size_type __n;
  uint *puVar6;
  reference rVar7;
  
  __n = (size_type)r;
  rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](v,__n);
  *rVar7._M_p = *rVar7._M_p | rVar7._M_mask;
  pvVar2 = (this->ou).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = *(uint **)((long)&pvVar2[__n].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + 8);
  for (puVar6 = *(uint **)&pvVar2[__n].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data; puVar6 != puVar3; puVar6 = puVar6 + 1) {
    uVar1 = *puVar6;
    pBVar4 = (this->super_GraphPropagator).es.data;
    if (sat.assigns.data[(uint)pBVar4[uVar1].v] != '\0') {
      bVar5 = BoolView::isFalse(pBVar4 + uVar1);
      if (!bVar5) {
        rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (v,(long)*(int *)(*(long *)&(this->super_GraphPropagator).endnodes.
                                                                                                            
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(int)uVar1].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data + 4));
        if ((*rVar7._M_p & rVar7._M_mask) == 0) {
          verificationDFS(this,*(int *)(*(long *)&(this->super_GraphPropagator).endnodes.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(int)uVar1].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data + 4),v);
        }
      }
    }
  }
  return;
}

Assistant:

void DReachabilityPropagator::verificationDFS(int r, std::vector<bool>& v) {
	v[r] = true;
	for (const int e : ou[r]) {
		if (!getEdgeVar(e).isFixed() || getEdgeVar(e).isFalse()) {
			continue;
		}
		if (!v[getHead(e)]) {
			verificationDFS(getHead(e), v);
		}
	}
}